

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O3

int __thiscall soplex::SVSetBase<double>::remove(SVSetBase<double> *this,char *__filename)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)(this->set).thenum;
  if (0 < lVar2) {
    uVar3 = lVar2 + 1;
    do {
      if (*(int *)(__filename + uVar3 * 4 + -8) < 0) {
        deleteVec(this,&(this->set).theitem[(this->set).thekey[uVar3 - 2].idx].data);
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  iVar1 = ClassSet<soplex::SVSetBase<double>::DLPSV>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void remove(int perm[])
   {
      int j = num();

      /* due to performance reasons we use a backwards loop to delete entries, because it could result instead of only
       * decreasing the number of elements j times in memmoving the whole array j times
       */
      for(int i = j - 1; i >= 0; --i)
      {
         if(perm[i] < 0)
         {
            deleteVec(&set[i]);
         }
      }

      set.remove(perm);
   }